

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqlite_delete_function(unqlite_vm *pVm,char *zName)

{
  jx9_vm *pBackend;
  sxu32 nKeyLen;
  sxi32 sVar1;
  jx9_user_func *pFunc;
  
  sVar1 = -0x18;
  if ((pVm != (unqlite_vm *)0x0) && (pVm->nMagic != 0xdead2bad)) {
    pBackend = pVm->pJx9Vm;
    pFunc = (jx9_user_func *)0x0;
    nKeyLen = SyStrlen(zName);
    sVar1 = SyHashDeleteEntry(&pBackend->hHostFunction,zName,nKeyLen,&pFunc);
    if (sVar1 == 0) {
      SySetRelease(&pFunc->aAux);
      SyMemBackendFree(&pBackend->sAllocator,(pFunc->sName).zString);
      SyMemBackendPoolFree(&pBackend->sAllocator,pFunc);
    }
  }
  return sVar1;
}

Assistant:

int unqlite_delete_function(unqlite_vm *pVm, const char *zName)
{
	int rc;
	if( UNQLITE_VM_MISUSE(pVm) ){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire VM mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_VM_RELEASE(pVm) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 /* Unlink the foreign function */
	 rc = jx9DeleteFunction(pVm->pJx9Vm,zName);
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}